

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O1

void leveldb::_Test_ConsumeDecimalNumberRoundtrip::_RunIt(void)

{
  pointer pcVar1;
  uint64_t num;
  uint64_t number;
  string sStack_1e0;
  undefined1 auStack_1c0 [24];
  stringstream asStack_1a8 [392];
  
  pcVar1 = auStack_1c0 + 0x10;
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(0,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(1,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(9,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(10,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(0xb,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(0x13,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(99,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(100,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(0x6d,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(0xbe,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"");
  ConsumeDecimalNumberRoundtripTest(0x7b,(string *)auStack_1c0);
  if ((pointer)auStack_1c0._0_8_ != pcVar1) {
    operator_delete((void *)auStack_1c0._0_8_);
  }
  auStack_1c0[0] = 1;
  auStack_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  auStack_1c0._16_4_ = 0x44;
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  NumberToString_abi_cxx11_(&sStack_1e0,(leveldb *)0xbc614e,num);
  test::Tester::IsEq<char[9],std::__cxx11::string>
            ((Tester *)auStack_1c0,(char (*) [9])"12345678",&sStack_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1e0._M_dataplus._M_p != &sStack_1e0.field_2) {
    operator_delete(sStack_1e0._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)auStack_1c0);
  number = 0xffffffffffffffff;
  do {
    auStack_1c0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_1c0,"","");
    ConsumeDecimalNumberRoundtripTest(number,(string *)auStack_1c0);
    if ((pointer)auStack_1c0._0_8_ != pcVar1) {
      operator_delete((void *)auStack_1c0._0_8_);
    }
    number = number - 1;
  } while (number != 0xffffffffffffff9b);
  return;
}

Assistant:

TEST(Logging, ConsumeDecimalNumberRoundtrip) {
  ConsumeDecimalNumberRoundtripTest(0);
  ConsumeDecimalNumberRoundtripTest(1);
  ConsumeDecimalNumberRoundtripTest(9);

  ConsumeDecimalNumberRoundtripTest(10);
  ConsumeDecimalNumberRoundtripTest(11);
  ConsumeDecimalNumberRoundtripTest(19);
  ConsumeDecimalNumberRoundtripTest(99);

  ConsumeDecimalNumberRoundtripTest(100);
  ConsumeDecimalNumberRoundtripTest(109);
  ConsumeDecimalNumberRoundtripTest(190);
  ConsumeDecimalNumberRoundtripTest(123);
  ASSERT_EQ("12345678", NumberToString(12345678));

  for (uint64_t i = 0; i < 100; ++i) {
    uint64_t large_number = std::numeric_limits<uint64_t>::max() - i;
    ConsumeDecimalNumberRoundtripTest(large_number);
  }
}